

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O1

int MuxImageFinalize(WebPMuxImage *wpi)

{
  uint32_t uVar1;
  WebPChunk *pWVar2;
  uint8_t *data;
  size_t data_size;
  int iVar3;
  uint uVar4;
  int vp8l_has_alpha;
  int h;
  int w;
  int local_2c;
  int local_28;
  int local_24;
  
  pWVar2 = wpi->img_;
  uVar1 = pWVar2->tag_;
  local_2c = 0;
  data = (pWVar2->data_).bytes;
  data_size = (pWVar2->data_).size;
  if (uVar1 == 0x4c385056) {
    iVar3 = VP8LGetInfo(data,data_size,&local_24,&local_28,&local_2c);
  }
  else {
    iVar3 = VP8GetInfo(data,data_size,data_size,&local_24,&local_28);
  }
  if (iVar3 != 0) {
    if ((uVar1 == 0x4c385056) && (wpi->alpha_ != (WebPChunk *)0x0)) {
      ChunkDelete(wpi->alpha_);
      wpi->alpha_ = (WebPChunk *)0x0;
    }
    wpi->width_ = local_24;
    wpi->height_ = local_28;
    uVar4 = 1;
    if (local_2c == 0) {
      uVar4 = (uint)(wpi->alpha_ != (WebPChunk *)0x0);
    }
    wpi->has_alpha_ = uVar4;
  }
  return iVar3;
}

Assistant:

int MuxImageFinalize(WebPMuxImage* const wpi) {
  const WebPChunk* const img = wpi->img_;
  const WebPData* const image = &img->data_;
  const int is_lossless = (img->tag_ == kChunks[IDX_VP8L].tag);
  int w, h;
  int vp8l_has_alpha = 0;
  const int ok = is_lossless ?
      VP8LGetInfo(image->bytes, image->size, &w, &h, &vp8l_has_alpha) :
      VP8GetInfo(image->bytes, image->size, image->size, &w, &h);
  assert(img != NULL);
  if (ok) {
    // Ignore ALPH chunk accompanying VP8L.
    if (is_lossless && (wpi->alpha_ != NULL)) {
      ChunkDelete(wpi->alpha_);
      wpi->alpha_ = NULL;
    }
    wpi->width_ = w;
    wpi->height_ = h;
    wpi->has_alpha_ = vp8l_has_alpha || (wpi->alpha_ != NULL);
  }
  return ok;
}